

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.cpp
# Opt level: O3

Tracer * __thiscall jaegertracing::Span::tracer(Span *this)

{
  int iVar1;
  element_type *peVar2;
  shared_ptr<opentracing::v3::Tracer> tracer;
  element_type *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->_mutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  peVar2 = (this->_tracer).
           super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    opentracing::v3::Tracer::Global();
    if (local_20 == (element_type *)0x0) {
      __assert_fail("tracer",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/Span.cpp"
                    ,0x7e,"virtual const opentracing::Tracer &jaegertracing::Span::tracer() const");
    }
    peVar2 = local_20;
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  return &peVar2->super_Tracer;
}

Assistant:

const opentracing::Tracer& Span::tracer() const noexcept
{
    std::lock_guard<std::mutex> lock(_mutex);
    if (_tracer) {
        return *_tracer;
    }
    auto tracer = opentracing::Tracer::Global();
    assert(tracer);
    return *tracer;
}